

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.h
# Opt level: O0

uint8_t find_average(uint8_t *src,int h_start,int h_end,int v_start,int v_end,int stride)

{
  uint64_t avg;
  int j;
  int i;
  uint64_t sum;
  int stride_local;
  int v_end_local;
  int v_start_local;
  int h_end_local;
  int h_start_local;
  uint8_t *src_local;
  
  sum = 0;
  for (i = v_start; j = h_start, i < v_end; i = i + 1) {
    for (; j < h_end; j = j + 1) {
      sum = src[i * stride + j] + sum;
    }
  }
  return (uint8_t)(sum / (ulong)(long)((v_end - v_start) * (h_end - h_start)));
}

Assistant:

static inline uint8_t find_average(const uint8_t *src, int h_start, int h_end,
                                   int v_start, int v_end, int stride) {
  uint64_t sum = 0;
  for (int i = v_start; i < v_end; i++) {
    for (int j = h_start; j < h_end; j++) {
      sum += src[i * stride + j];
    }
  }
  uint64_t avg = sum / ((v_end - v_start) * (h_end - h_start));
  return (uint8_t)avg;
}